

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_resp_handlers.cxx
# Opt level: O0

void __thiscall cornerstone::raft_server::handle_ext_resp_err(raft_server *this,rpc_exception *err)

{
  const_iterator __position;
  bool bVar1;
  msg_type mVar2;
  int32 iVar3;
  int iVar4;
  uint uVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  size_type sVar9;
  function<void_()> *this_00;
  element_type *peVar10;
  long *in_RSI;
  long in_RDI;
  ptr<delayed_task> task;
  executor exec;
  peer_itor pit_1;
  lock_guard<std::shared_timed_mutex> wlock;
  peer_itor pit;
  shared_lock<std::shared_timed_mutex> rlock;
  ptr<peer> p;
  ptr<req_msg> req;
  rpc_exception *in_stack_fffffffffffff978;
  strfmt<200> *in_stack_fffffffffffff980;
  undefined4 in_stack_fffffffffffff988;
  undefined4 in_stack_fffffffffffff98c;
  __shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2> *in_stack_fffffffffffff990;
  undefined4 in_stack_fffffffffffff9b0;
  undefined4 in_stack_fffffffffffff9b4;
  char *in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c4;
  shared_ptr<cornerstone::timer_task<void>_> local_550;
  undefined1 local_540 [95];
  allocator<char> local_4e1;
  string local_4e0 [39];
  allocator<char> local_4b9 [5];
  int32 in_stack_fffffffffffffb4c;
  raft_server *in_stack_fffffffffffffb50;
  string local_3e8 [39];
  allocator<char> local_3c1;
  strfmt<100> local_3c0;
  string local_350 [39];
  allocator<char> local_329;
  strfmt<100> local_328;
  string local_2b8 [32];
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false> local_298;
  __node_type *local_290;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false> local_288;
  int32 local_27c;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false> local_278;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
  local_270 [2];
  allocator<char> local_259;
  strfmt<200> local_258;
  string local_188 [32];
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false> local_168;
  int32 local_15c;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false> local_158;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
  local_150 [9];
  allocator<char> local_101;
  strfmt<200> local_100;
  string local_30 [32];
  long *local_10;
  
  local_10 = in_RSI;
  peVar6 = std::__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1e1803);
  strfmt<200>::strfmt(&local_100,"receive an rpc error response from peer server, %s");
  (**(code **)(*local_10 + 0x10))();
  strfmt<200>::fmt<char_const*>(in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),in_stack_fffffffffffff9b8
             ,(allocator<char> *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
  (*peVar6->_vptr_logger[2])(peVar6,local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_101);
  rpc_exception::req(in_stack_fffffffffffff978);
  peVar7 = std::__shared_ptr_access<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e18e3);
  mVar2 = msg_base::get_type(&peVar7->super_msg_base);
  if (mVar2 != sync_log_request) {
    peVar7 = std::
             __shared_ptr_access<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e190d);
    mVar2 = msg_base::get_type(&peVar7->super_msg_base);
    if (mVar2 != join_cluster_request) {
      peVar7 = std::
               __shared_ptr_access<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1e1937);
      mVar2 = msg_base::get_type(&peVar7->super_msg_base);
      if (mVar2 != leave_cluster_request) goto LAB_001e24a2;
    }
  }
  std::shared_ptr<cornerstone::peer>::shared_ptr((shared_ptr<cornerstone::peer> *)0x1e1965);
  peVar7 = std::__shared_ptr_access<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e1972);
  mVar2 = msg_base::get_type(&peVar7->super_msg_base);
  if (mVar2 == leave_cluster_request) {
    std::shared_lock<std::shared_timed_mutex>::shared_lock
              ((shared_lock<std::shared_timed_mutex> *)in_stack_fffffffffffff980,
               (mutex_type *)in_stack_fffffffffffff978);
    peVar7 = std::
             __shared_ptr_access<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e19d2);
    local_15c = msg_base::get_dst(&peVar7->super_msg_base);
    local_158._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
         ::find((unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
                 *)in_stack_fffffffffffff978,(key_type *)0x1e1a06);
    std::__detail::
    _Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>::
    _Node_const_iterator
              ((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
                *)in_stack_fffffffffffff980,
               (_Node_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
                *)in_stack_fffffffffffff978);
    local_168._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
         ::end((unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
                *)in_stack_fffffffffffff978);
    bVar1 = std::__detail::operator!=(local_150,&local_168);
    if (bVar1) {
      std::__detail::
      _Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
      ::operator->((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
                    *)0x1e1a7c);
      std::shared_ptr<cornerstone::peer>::operator=
                ((shared_ptr<cornerstone::peer> *)in_stack_fffffffffffff980,
                 (shared_ptr<cornerstone::peer> *)in_stack_fffffffffffff978);
    }
    std::shared_lock<std::shared_timed_mutex>::~shared_lock
              ((shared_lock<std::shared_timed_mutex> *)in_stack_fffffffffffff980);
  }
  else {
    std::shared_ptr<cornerstone::peer>::operator=
              ((shared_ptr<cornerstone::peer> *)in_stack_fffffffffffff980,
               (shared_ptr<cornerstone::peer> *)in_stack_fffffffffffff978);
  }
  bVar1 = std::operator!=((shared_ptr<cornerstone::peer> *)in_stack_fffffffffffff980,
                          in_stack_fffffffffffff978);
  if (bVar1) {
    peVar8 = std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e1b88);
    iVar3 = peer::get_current_hb_interval(peVar8);
    std::unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_>::operator->
              ((unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_> *)
               0x1e1baa);
    std::unique_ptr<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>::
    operator->((unique_ptr<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>
                *)0x1e1bb6);
    iVar4 = raft_params::max_hb_interval((raft_params *)in_stack_fffffffffffff980);
    if (iVar3 < iVar4) {
      this_00 = (function<void_()> *)
                std::
                __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1e2255);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                 in_stack_fffffffffffff9b8,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
      (*(*(_func_int ***)&(this_00->super__Function_base)._M_functor)[2])(this_00,local_4e0);
      std::__cxx11::string::~string(local_4e0);
      std::allocator<char>::~allocator(&local_4e1);
      std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1e22c6);
      peer::slow_down_hb((peer *)in_stack_fffffffffffff980);
      std::shared_ptr<cornerstone::peer>::shared_ptr
                ((shared_ptr<cornerstone::peer> *)in_stack_fffffffffffff980,
                 (shared_ptr<cornerstone::peer> *)in_stack_fffffffffffff978);
      std::shared_ptr<cornerstone::req_msg>::shared_ptr
                ((shared_ptr<cornerstone::req_msg> *)in_stack_fffffffffffff980,
                 (shared_ptr<cornerstone::req_msg> *)in_stack_fffffffffffff978);
      std::function<void()>::
      function<cornerstone::raft_server::handle_ext_resp_err(cornerstone::rpc_exception&)::__0,void>
                (this_00,(anon_class_40_3_69179649 *)
                         CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
      handle_ext_resp_err(cornerstone::rpc_exception&)::$_0::~__0
                ((anon_class_40_3_69179649 *)in_stack_fffffffffffff980);
      cs_new<cornerstone::timer_task<void>,std::function<void()>&>
                ((function<void_()> *)in_stack_fffffffffffff978);
      std::shared_ptr<cornerstone::delayed_task>::shared_ptr<cornerstone::timer_task<void>,void>
                ((shared_ptr<cornerstone::delayed_task> *)in_stack_fffffffffffff980,&local_550);
      std::shared_ptr<cornerstone::timer_task<void>_>::~shared_ptr
                ((shared_ptr<cornerstone::timer_task<void>_> *)0x1e2367);
      peVar10 = std::
                __shared_ptr_access<cornerstone::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<cornerstone::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1e2378);
      peVar8 = std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e238a);
      uVar5 = peer::get_current_hb_interval(peVar8);
      (*peVar10->_vptr_delayed_task_scheduler[2])(peVar10,local_540,(ulong)uVar5);
      std::shared_ptr<cornerstone::delayed_task>::~shared_ptr
                ((shared_ptr<cornerstone::delayed_task> *)0x1e23c1);
      std::function<void_()>::~function((function<void_()> *)0x1e23ce);
    }
    else {
      peVar7 = std::
               __shared_ptr_access<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1e1bea);
      mVar2 = msg_base::get_type(&peVar7->super_msg_base);
      if (mVar2 == leave_cluster_request) {
        peVar6 = std::
                 __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1e1c1f);
        strfmt<200>::strfmt(&local_258,
                            "rpc failed again for the removing server (%d), will remove this server directly"
                           );
        std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1e1c4a);
        peer::get_id((peer *)0x1e1c52);
        strfmt<200>::fmt<int>
                  (in_stack_fffffffffffff980,(int)((ulong)in_stack_fffffffffffff978 >> 0x20));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                   in_stack_fffffffffffff9b8,
                   (allocator<char> *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0))
        ;
        (*peVar6->_vptr_logger[3])(peVar6,local_188);
        std::__cxx11::string::~string(local_188);
        std::allocator<char>::~allocator(&local_259);
        std::lock_guard<std::shared_timed_mutex>::lock_guard
                  ((lock_guard<std::shared_timed_mutex> *)in_stack_fffffffffffff980,
                   (mutex_type *)in_stack_fffffffffffff978);
        sVar9 = std::
                unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
                ::size((unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
                        *)0x1e1d14);
        if (sVar9 == 1) {
          std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1e1d3f);
          local_27c = peer::get_id((peer *)0x1e1d47);
          local_278._M_cur =
               (__node_type *)
               std::
               unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
               ::find((unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
                       *)in_stack_fffffffffffff978,(key_type *)0x1e1d73);
          std::__detail::
          _Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
          ::_Node_const_iterator
                    ((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
                      *)in_stack_fffffffffffff980,
                     (_Node_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
                      *)in_stack_fffffffffffff978);
          local_288._M_cur =
               (__node_type *)
               std::
               unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
               ::end((unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
                      *)in_stack_fffffffffffff978);
          iVar4 = (int)((ulong)in_stack_fffffffffffff978 >> 0x20);
          bVar1 = std::__detail::operator!=(local_270,&local_288);
          if (bVar1) {
            std::__detail::
            _Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
            ::operator->((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
                          *)0x1e1de9);
            std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1e1df5);
            peer::enable_hb((peer *)in_stack_fffffffffffff980,SUB41((uint)iVar4 >> 0x18,0));
            local_290 = local_270[0]._M_cur;
            __position.
            super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
            ._M_cur._4_4_ = in_stack_fffffffffffff98c;
            __position.
            super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
            ._M_cur._0_4_ = in_stack_fffffffffffff988;
            local_298._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
                 ::erase((unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
                          *)in_stack_fffffffffffff980,__position);
            peVar6 = std::
                     __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1e1e58);
            strfmt<100>::strfmt(&local_328,"server %d is removed from cluster");
            std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1e1e83);
            peer::get_id((peer *)0x1e1e8b);
            strfmt<100>::fmt<int>((strfmt<100> *)in_stack_fffffffffffff980,iVar4);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                       in_stack_fffffffffffff9b8,
                       (allocator<char> *)
                       CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
            (*peVar6->_vptr_logger[3])(peVar6,local_2b8);
            std::__cxx11::string::~string(local_2b8);
            std::allocator<char>::~allocator(&local_329);
          }
          else {
            peVar6 = std::
                     __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1e1fd3);
            strfmt<100>::strfmt(&local_3c0,"peer %d cannot be found, no action for removing");
            std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1e1ffb);
            peer::get_id((peer *)0x1e2003);
            strfmt<100>::fmt<int>((strfmt<100> *)in_stack_fffffffffffff980,iVar4);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                       in_stack_fffffffffffff9b8,
                       (allocator<char> *)
                       CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
            (*peVar6->_vptr_logger[3])(peVar6,local_350);
            std::__cxx11::string::~string(local_350);
            std::allocator<char>::~allocator(&local_3c1);
          }
        }
        std::lock_guard<std::shared_timed_mutex>::~lock_guard
                  ((lock_guard<std::shared_timed_mutex> *)0x1e20d5);
        std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1e20e2);
        peer::get_id((peer *)0x1e20ea);
        rm_srv_from_cluster(in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
      }
      else {
        peVar6 = std::
                 __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1e212e);
        iVar4 = (int)((ulong)in_stack_fffffffffffff978 >> 0x20);
        strfmt<200>::strfmt((strfmt<200> *)(local_4b9 + 1),
                            "rpc failed again for the new coming server (%d), will stop retry for this server"
                           );
        std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1e2156);
        iVar3 = peer::get_id((peer *)0x1e215e);
        strfmt<200>::fmt<int>(in_stack_fffffffffffff980,iVar4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),(char *)peVar6,
                   (allocator<char> *)CONCAT44(iVar3,in_stack_fffffffffffff9b0));
        (*peVar6->_vptr_logger[3])(peVar6,local_3e8);
        std::__cxx11::string::~string(local_3e8);
        std::allocator<char>::~allocator(local_4b9);
        *(undefined1 *)(in_RDI + 0x29) = 0;
        std::__shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>::reset
                  (in_stack_fffffffffffff990);
      }
    }
  }
  std::shared_ptr<cornerstone::peer>::~shared_ptr((shared_ptr<cornerstone::peer> *)0x1e2491);
LAB_001e24a2:
  std::shared_ptr<cornerstone::req_msg>::~shared_ptr((shared_ptr<cornerstone::req_msg> *)0x1e24af);
  return;
}

Assistant:

void raft_server::handle_ext_resp_err(rpc_exception& err)
{
    l_->debug(lstrfmt("receive an rpc error response from peer server, %s").fmt(err.what()));
    ptr<req_msg> req = err.req();
    if (req->get_type() == msg_type::sync_log_request || req->get_type() == msg_type::join_cluster_request ||
        req->get_type() == msg_type::leave_cluster_request)
    {
        ptr<peer> p;
        if (req->get_type() == msg_type::leave_cluster_request)
        {
            read_lock(peers_lock_);
            peer_itor pit = peers_.find(req->get_dst());
            if (pit != peers_.end())
            {
                p = pit->second;
            }
        }
        else
        {
            p = srv_to_join_;
        }

        if (p != nilptr)
        {
            if (p->get_current_hb_interval() >= ctx_->params_->max_hb_interval())
            {
                if (req->get_type() == msg_type::leave_cluster_request)
                {
                    l_->info(lstrfmt("rpc failed again for the removing server (%d), will remove this server directly")
                                 .fmt(p->get_id()));

                    /**
                     * In case of there are only two servers in the cluster, it safe to remove the server directly from
                     * peers as at most one config change could happen at a time prove: assume there could be two config
                     * changes at a time this means there must be a leader after previous leader offline, which is
                     * impossible (no leader could be elected after one server goes offline in case of only two servers
                     * in a cluster) so the bug https://groups.google.com/forum/#!topic/raft-dev/t4xj6dJTP6E does not
                     * apply to cluster which only has two members
                     */
                    {
                        write_lock(peers_lock_);
                        if (peers_.size() == 1)
                        {
                            peer_itor pit = peers_.find(p->get_id());
                            if (pit != peers_.end())
                            {
                                pit->second->enable_hb(false);
                                peers_.erase(pit);
                                l_->info(sstrfmt("server %d is removed from cluster").fmt(p->get_id()));
                            }
                            else
                            {
                                l_->info(sstrfmt("peer %d cannot be found, no action for removing").fmt(p->get_id()));
                            }
                        }
                    }

                    rm_srv_from_cluster(p->get_id());
                }
                else
                {
                    l_->info(lstrfmt("rpc failed again for the new coming server (%d), will stop retry for this server")
                                 .fmt(p->get_id()));
                    config_changing_ = false;
                    srv_to_join_.reset();
                }
            }
            else
            {
                // reuse the heartbeat interval value to indicate when to stop retrying, as rpc backoff is the same
                l_->debug("retry the request");
                p->slow_down_hb();
                timer_task<void>::executor exec = [this, p, req]() mutable { this->on_retryable_req_err(p, req); };
                ptr<delayed_task> task(cs_new<timer_task<void>>(exec));
                scheduler_->schedule(task, p->get_current_hb_interval());
            }
        }
    }
}